

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransporthttp.c
# Opt level: O0

_Bool abandonOrAcceptMessage
                (HTTPTRANSPORT_HANDLE_DATA *handleData,HTTPTRANSPORT_PERDEVICE_DATA *deviceData,
                char *ETag,IOTHUBMESSAGE_DISPOSITION_RESULT action)

{
  HTTPAPIEX_HANDLE pHVar1;
  HTTPAPIEX_SAS_HANDLE sasHandle;
  int iVar2;
  HTTP_HEADERS_RESULT HVar3;
  HTTPAPI_REQUEST_TYPE HVar4;
  char *pcVar5;
  size_t sVar6;
  char *value;
  LOGGER_LOG p_Var7;
  undefined8 in_stack_ffffffffffffff08;
  uint *statusCode_00;
  undefined4 uVar8;
  char *local_a8;
  LOGGER_LOG l_8;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  HTTPAPIEX_RESULT r;
  uint statusCode;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  HTTP_HEADERS_HANDLE abandonRequestHttpHeaders;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  STRING_HANDLE ETagUnquoted;
  LOGGER_LOG l;
  STRING_HANDLE fullAbandonRelativePath;
  _Bool result;
  char *pcStack_20;
  IOTHUBMESSAGE_DISPOSITION_RESULT action_local;
  char *ETag_local;
  HTTPTRANSPORT_PERDEVICE_DATA *deviceData_local;
  HTTPTRANSPORT_HANDLE_DATA *handleData_local;
  
  uVar8 = (undefined4)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  fullAbandonRelativePath._4_4_ = action;
  pcStack_20 = ETag;
  ETag_local = (char *)deviceData;
  deviceData_local = (HTTPTRANSPORT_PERDEVICE_DATA *)handleData;
  l = (LOGGER_LOG)STRING_clone(deviceData->abandonHTTPrelativePathBegin);
  if ((STRING_HANDLE)l == (STRING_HANDLE)0x0) {
    ETagUnquoted = (STRING_HANDLE)xlogging_get_log_function();
    if (ETagUnquoted != (STRING_HANDLE)0x0) {
      (*(code *)ETagUnquoted)
                (0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                 ,"abandonOrAcceptMessage",0x6bc,1,"unable to STRING_clone");
    }
    fullAbandonRelativePath._3_1_ = 0;
    goto LAB_0013347b;
  }
  pcVar5 = pcStack_20 + 1;
  sVar6 = strlen(pcStack_20);
  l_1 = (LOGGER_LOG)STRING_construct_n(pcVar5,sVar6 - 2);
  if ((STRING_HANDLE)l_1 == (STRING_HANDLE)0x0) {
    l_2 = xlogging_get_log_function();
    if (l_2 != (LOGGER_LOG)0x0) {
      (*l_2)(AZ_LOG_ERROR,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
             ,"abandonOrAcceptMessage",0x6c4,1,"unable to STRING_construct_n");
    }
    fullAbandonRelativePath._3_1_ = 0;
  }
  else {
    iVar2 = STRING_concat_with_STRING((STRING_HANDLE)l,(STRING_HANDLE)l_1);
    if (iVar2 == 0) {
      if (fullAbandonRelativePath._4_4_ == IOTHUBMESSAGE_ABANDONED) {
        local_a8 = "/abandon?api-version=2016-11-14";
      }
      else {
        local_a8 = "?api-version=2016-11-14";
        if (fullAbandonRelativePath._4_4_ == IOTHUBMESSAGE_REJECTED) {
          local_a8 = "?api-version=2016-11-14&reject";
        }
      }
      iVar2 = STRING_concat((STRING_HANDLE)l,local_a8);
      if (iVar2 != 0) goto LAB_001330ba;
      l_3 = (LOGGER_LOG)HTTPHeaders_Alloc();
      if ((HTTP_HEADERS_HANDLE)l_3 == (HTTP_HEADERS_HANDLE)0x0) {
        l_4 = xlogging_get_log_function();
        if (l_4 != (LOGGER_LOG)0x0) {
          (*l_4)(AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                 ,"abandonOrAcceptMessage",0x6d6,1,"unable to HTTPHeaders_Alloc");
        }
        fullAbandonRelativePath._3_1_ = 0;
      }
      else {
        HVar3 = addUserAgentHeaderInfo
                          ((HTTPTRANSPORT_HANDLE_DATA *)deviceData_local,(HTTP_HEADERS_HANDLE)l_3);
        if (((HVar3 == HTTP_HEADERS_OK) &&
            (HVar3 = HTTPHeaders_AddHeaderNameValuePair
                               ((HTTP_HEADERS_HANDLE)l_3,IOTHUB_AUTH_HEADER_VALUE," "),
            HVar3 == HTTP_HEADERS_OK)) &&
           (HVar3 = HTTPHeaders_AddHeaderNameValuePair
                              ((HTTP_HEADERS_HANDLE)l_3,"If-Match",pcStack_20), p_Var7 = l_3,
           pcVar5 = IOTHUB_AUTH_HEADER_VALUE, HVar3 == HTTP_HEADERS_OK)) {
          l_5._4_4_ = 0;
          if (*(long *)(ETag_local + 0x18) == 0) {
            sasHandle = *(HTTPAPIEX_SAS_HANDLE *)(ETag_local + 0x48);
            pHVar1 = (HTTPAPIEX_HANDLE)deviceData_local->deviceId;
            HVar4 = HTTPAPI_REQUEST_DELETE;
            if (fullAbandonRelativePath._4_4_ == IOTHUBMESSAGE_ABANDONED) {
              HVar4 = HTTPAPI_REQUEST_POST;
            }
            pcVar5 = STRING_c_str((STRING_HANDLE)l);
            statusCode_00 = (uint *)((long)&l_5 + 4);
            l_5._0_4_ = HTTPAPIEX_SAS_ExecuteRequest
                                  (sasHandle,pHVar1,HVar4,pcVar5,(HTTP_HEADERS_HANDLE)l_3,
                                   (BUFFER_HANDLE)0x0,statusCode_00,(HTTP_HEADERS_HANDLE)0x0,
                                   (BUFFER_HANDLE)0x0);
            uVar8 = (undefined4)((ulong)statusCode_00 >> 0x20);
            if (((HTTPAPIEX_RESULT)l_5 != HTTPAPIEX_OK) &&
               (p_Var7 = xlogging_get_log_function(), p_Var7 != (LOGGER_LOG)0x0)) {
              (*p_Var7)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                        ,"abandonOrAcceptMessage",0x709,1,"unable to HTTPAPIEX_SAS_ExecuteRequest");
            }
          }
          else {
            value = STRING_c_str(*(STRING_HANDLE *)(ETag_local + 0x18));
            HVar3 = HTTPHeaders_ReplaceHeaderNameValuePair((HTTP_HEADERS_HANDLE)p_Var7,pcVar5,value)
            ;
            if (HVar3 == HTTP_HEADERS_OK) {
              pHVar1 = (HTTPAPIEX_HANDLE)deviceData_local->deviceId;
              HVar4 = HTTPAPI_REQUEST_DELETE;
              if (fullAbandonRelativePath._4_4_ == IOTHUBMESSAGE_ABANDONED) {
                HVar4 = HTTPAPI_REQUEST_POST;
              }
              pcVar5 = STRING_c_str((STRING_HANDLE)l);
              uVar8 = 0;
              l_5._0_4_ = HTTPAPIEX_ExecuteRequest
                                    (pHVar1,HVar4,pcVar5,(HTTP_HEADERS_HANDLE)l_3,(BUFFER_HANDLE)0x0
                                     ,(uint *)((long)&l_5 + 4),(HTTP_HEADERS_HANDLE)0x0,
                                     (BUFFER_HANDLE)0x0);
              if (((HTTPAPIEX_RESULT)l_5 != HTTPAPIEX_OK) &&
                 (p_Var7 = xlogging_get_log_function(), p_Var7 != (LOGGER_LOG)0x0)) {
                (*p_Var7)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                          ,"abandonOrAcceptMessage",0x6fa,1,"Unable to HTTPAPIEX_ExecuteRequest.");
              }
            }
            else {
              l_5._0_4_ = HTTPAPIEX_ERROR;
              p_Var7 = xlogging_get_log_function();
              if (p_Var7 != (LOGGER_LOG)0x0) {
                (*p_Var7)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                          ,"abandonOrAcceptMessage",0x6ed,1,"Unable to replace the old SAS Token.");
              }
            }
          }
          if ((HTTPAPIEX_RESULT)l_5 == HTTPAPIEX_OK) {
            if (l_5._4_4_ == 0xcc) {
              fullAbandonRelativePath._3_1_ = 1;
            }
            else {
              p_Var7 = xlogging_get_log_function();
              if (p_Var7 != (LOGGER_LOG)0x0) {
                (*p_Var7)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                          ,"abandonOrAcceptMessage",0x70f,1,
                          "unexpected status code returned %u (was expecting 204)",
                          CONCAT44(uVar8,l_5._4_4_));
              }
              fullAbandonRelativePath._3_1_ = 0;
            }
          }
          else {
            fullAbandonRelativePath._3_1_ = 0;
          }
        }
        else {
          _r = xlogging_get_log_function();
          if (_r != (LOGGER_LOG)0x0) {
            (*_r)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                  ,"abandonOrAcceptMessage",0x6e1,1,"unable to HTTPHeaders_AddHeaderNameValuePair");
          }
          fullAbandonRelativePath._3_1_ = 0;
        }
        HTTPHeaders_Free((HTTP_HEADERS_HANDLE)l_3);
      }
    }
    else {
LAB_001330ba:
      abandonRequestHttpHeaders = (HTTP_HEADERS_HANDLE)xlogging_get_log_function();
      if (abandonRequestHttpHeaders != (HTTP_HEADERS_HANDLE)0x0) {
        (*(code *)abandonRequestHttpHeaders)
                  (0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                   ,"abandonOrAcceptMessage",0x6ce,1,"unable to STRING_concat");
      }
      fullAbandonRelativePath._3_1_ = 0;
    }
    STRING_delete((STRING_HANDLE)l_1);
  }
  STRING_delete((STRING_HANDLE)l);
LAB_0013347b:
  return (_Bool)(fullAbandonRelativePath._3_1_ & 1);
}

Assistant:

static bool abandonOrAcceptMessage(HTTPTRANSPORT_HANDLE_DATA* handleData, HTTPTRANSPORT_PERDEVICE_DATA* deviceData, const char* ETag, IOTHUBMESSAGE_DISPOSITION_RESULT action)
{
    bool result;
    STRING_HANDLE fullAbandonRelativePath = STRING_clone(deviceData->abandonHTTPrelativePathBegin);
    if (fullAbandonRelativePath == NULL)
    {
        LogError("unable to STRING_clone");
        result = false;
    }
    else
    {
        STRING_HANDLE ETagUnquoted = STRING_construct_n(ETag + 1, strlen(ETag) - 2); /*skip first character which is '"' and the last one (which is also '"')*/
        if (ETagUnquoted == NULL)
        {
            LogError("unable to STRING_construct_n");
            result = false;
        }
        else
        {
            if (!(
                (STRING_concat_with_STRING(fullAbandonRelativePath, ETagUnquoted) == 0) &&
                (STRING_concat(fullAbandonRelativePath, (action == IOTHUBMESSAGE_ABANDONED) ? "/abandon" API_VERSION : ((action == IOTHUBMESSAGE_REJECTED) ? API_VERSION "&reject" : API_VERSION)) == 0)
                ))
            {
                LogError("unable to STRING_concat");
                result = false;
            }
            else
            {
                HTTP_HEADERS_HANDLE abandonRequestHttpHeaders = HTTPHeaders_Alloc();
                if (abandonRequestHttpHeaders == NULL)
                {
                    LogError("unable to HTTPHeaders_Alloc");
                    result = false;
                }
                else
                {
                    if (!(
                        (addUserAgentHeaderInfo(handleData, abandonRequestHttpHeaders) == HTTP_HEADERS_OK) &&
                        (HTTPHeaders_AddHeaderNameValuePair(abandonRequestHttpHeaders, IOTHUB_AUTH_HEADER_VALUE, " ") == HTTP_HEADERS_OK) &&
                        (HTTPHeaders_AddHeaderNameValuePair(abandonRequestHttpHeaders, "If-Match", ETag) == HTTP_HEADERS_OK)
                        ))
                    {
                        LogError("unable to HTTPHeaders_AddHeaderNameValuePair");
                        result = false;
                    }
                    else
                    {
                        unsigned int statusCode = 0;
                        HTTPAPIEX_RESULT r;
                        if (deviceData->deviceSasToken != NULL)
                        {
                            if (HTTPHeaders_ReplaceHeaderNameValuePair(abandonRequestHttpHeaders, IOTHUB_AUTH_HEADER_VALUE, STRING_c_str(deviceData->deviceSasToken)) != HTTP_HEADERS_OK)
                            {
                                r = HTTPAPIEX_ERROR;
                                LogError("Unable to replace the old SAS Token.");
                            }
                            else if ((r = HTTPAPIEX_ExecuteRequest(
                                handleData->httpApiExHandle,
                                (action == IOTHUBMESSAGE_ABANDONED) ? HTTPAPI_REQUEST_POST : HTTPAPI_REQUEST_DELETE,                               /*-requestType: POST                                                                                                       */
                                STRING_c_str(fullAbandonRelativePath),              /*-relativePath: abandon relative path begin (as created by _Create) + value of ETag + "/abandon?api-version=2016-11-14"   */
                                abandonRequestHttpHeaders,                          /*- requestHttpHeadersHandle: an HTTP headers instance containing the following                                            */
                                NULL,                                               /*- requestContent: NULL                                                                                                   */
                                &statusCode,                                         /*- statusCode: a pointer to unsigned int which might be examined for logging                                              */
                                NULL,                                               /*- responseHeadearsHandle: NULL                                                                                           */
                                NULL                                                /*- responseContent: NULL]                                                                                                 */
                            )) != HTTPAPIEX_OK)
                            {
                                LogError("Unable to HTTPAPIEX_ExecuteRequest.");
                            }
                        }
                        else if ((r = HTTPAPIEX_SAS_ExecuteRequest(
                            deviceData->sasObject,
                            handleData->httpApiExHandle,
                            (action == IOTHUBMESSAGE_ABANDONED) ? HTTPAPI_REQUEST_POST : HTTPAPI_REQUEST_DELETE,                               /*-requestType: POST                                                                                                       */
                            STRING_c_str(fullAbandonRelativePath),              /*-relativePath: abandon relative path begin (as created by _Create) + value of ETag + "/abandon?api-version=2016-11-14"   */
                            abandonRequestHttpHeaders,                          /*- requestHttpHeadersHandle: an HTTP headers instance containing the following                                            */
                            NULL,                                               /*- requestContent: NULL                                                                                                   */
                            &statusCode,                                         /*- statusCode: a pointer to unsigned int which might be examined for logging                                              */
                            NULL,                                               /*- responseHeadearsHandle: NULL                                                                                           */
                            NULL                                                /*- responseContent: NULL]                                                                                                 */
                        )) != HTTPAPIEX_OK)
                        {
                            LogError("unable to HTTPAPIEX_SAS_ExecuteRequest");
                        }
                        if (r == HTTPAPIEX_OK)
                        {
                            if (statusCode != 204)
                            {
                                LogError("unexpected status code returned %u (was expecting 204)", statusCode);
                                result = false;
                            }
                            else
                            {
                                /*all is fine*/
                                result = true;
                            }
                        }
                        else
                        {
                            result = false;
                        }
                    }
                    HTTPHeaders_Free(abandonRequestHttpHeaders);
                }
            }
            STRING_delete(ETagUnquoted);
        }
        STRING_delete(fullAbandonRelativePath);
    }
    return result;
}